

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto-simplification.cpp
# Opt level: O0

void __thiscall
autoSimplification_associative5_Test::TestBody(autoSimplification_associative5_Test *this)

{
  bool bVar1;
  char *message;
  ExprPtr *ex;
  AssertHelper local_1e8;
  Message local_1e0;
  string local_1d8;
  undefined1 local_1b8 [8];
  AssertionResult gtest_ar;
  ExprPtr local_198;
  ExprPtr local_188;
  ExprPtr local_178;
  ExprPtr local_168;
  ExprPtr local_158;
  ExprPtr local_148;
  ExprPtr local_138;
  ExprPtr local_128;
  ExprPtr local_118;
  undefined1 local_108 [8];
  ExprPtr e;
  string local_f0;
  undefined1 local_d0 [8];
  ExprPtr z;
  string local_b8;
  undefined1 local_98 [8];
  ExprPtr y;
  string local_80;
  undefined1 local_60 [8];
  ExprPtr x;
  ExprPtr n4;
  undefined1 local_30 [8];
  ExprPtr n3;
  ExprPtr n2;
  autoSimplification_associative5_Test *this_local;
  
  mathiu::impl::operator____i
            ((impl *)&n3.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,2);
  mathiu::impl::operator____i((impl *)local_30,3);
  mathiu::impl::operator____i
            ((impl *)&x.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"x",
             (allocator<char> *)
             ((long)&y.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  mathiu::impl::symbol((impl *)local_60,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&y.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"y",
             (allocator<char> *)
             ((long)&z.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  mathiu::impl::symbol((impl *)local_98,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&z.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"z",
             (allocator<char> *)
             ((long)&e.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  mathiu::impl::symbol((impl *)local_d0,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&e.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  mathiu::impl::operator*((impl *)&local_148,(ExprPtr *)local_60,(ExprPtr *)local_98);
  mathiu::impl::operator*((impl *)&local_138,&local_148,(ExprPtr *)local_d0);
  mathiu::impl::operator*
            ((impl *)&local_128,
             (ExprPtr *)
             &n3.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,&local_138);
  mathiu::impl::operator*((impl *)&local_168,(ExprPtr *)local_30,(ExprPtr *)local_60);
  mathiu::impl::operator*((impl *)&local_178,(ExprPtr *)local_98,(ExprPtr *)local_d0);
  mathiu::impl::operator*((impl *)&local_158,&local_168,&local_178);
  mathiu::impl::operator+((impl *)&local_118,&local_128,&local_158);
  mathiu::impl::operator*((impl *)&gtest_ar.message_,(ExprPtr *)local_60,(ExprPtr *)local_98);
  mathiu::impl::operator*
            ((impl *)&local_198,
             (ExprPtr *)
             &x.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ,(ExprPtr *)&gtest_ar.message_);
  mathiu::impl::operator*((impl *)&local_188,&local_198,(ExprPtr *)local_d0);
  mathiu::impl::operator+((impl *)local_108,&local_118,&local_188);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr(&local_188);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr(&local_198);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr
            ((shared_ptr<const_mathiu::impl::Expr> *)&gtest_ar.message_);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr(&local_118);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr(&local_158);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr(&local_178);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr(&local_168);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr(&local_128);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr(&local_138);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr(&local_148);
  mathiu::impl::toString_abi_cxx11_(&local_1d8,(impl *)local_108,ex);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[12],_nullptr>
            ((EqHelper *)local_1b8,"toString(e)","\"(* 9 x y z)\"",&local_1d8,
             (char (*) [12])"(* 9 x y z)");
  std::__cxx11::string::~string((string *)&local_1d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b8);
  if (!bVar1) {
    testing::Message::Message(&local_1e0);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_1b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/test/mathiu/auto-simplification.cpp"
               ,0x149,message);
    testing::internal::AssertHelper::operator=(&local_1e8,&local_1e0);
    testing::internal::AssertHelper::~AssertHelper(&local_1e8);
    testing::Message::~Message(&local_1e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b8);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr
            ((shared_ptr<const_mathiu::impl::Expr> *)local_108);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr
            ((shared_ptr<const_mathiu::impl::Expr> *)local_d0);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr
            ((shared_ptr<const_mathiu::impl::Expr> *)local_98);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr
            ((shared_ptr<const_mathiu::impl::Expr> *)local_60);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr
            ((shared_ptr<const_mathiu::impl::Expr> *)
             &x.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr
            ((shared_ptr<const_mathiu::impl::Expr> *)local_30);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr
            ((shared_ptr<const_mathiu::impl::Expr> *)
             &n3.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

TEST(autoSimplification, associative5)
{
    auto const n2 = 2_i;
    auto const n3 = 3_i;
    auto const n4 = 4_i;
    auto const x = symbol("x");
    auto const y = symbol("y");
    auto const z = symbol("z");
    auto const e = n2 * (x * y * z) + n3 * x * (y * z) + n4 * (x * y) * z;
    EXPECT_EQ(toString(e), "(* 9 x y z)");
}